

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void __thiscall
xe::TestGroup::TestGroup
          (TestGroup *this,TestGroup *parent,TestNodeType nodeType,char *name,char *description)

{
  char *description_local;
  char *name_local;
  TestNodeType nodeType_local;
  TestGroup *parent_local;
  TestGroup *this_local;
  
  TestNode::TestNode(&this->super_TestNode,parent,nodeType,name,description);
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestGroup_0018ce78;
  std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>::vector(&this->m_children);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_childNames);
  return;
}

Assistant:

TestGroup::TestGroup (TestGroup* parent, TestNodeType nodeType, const char* name, const char* description)
	: TestNode(parent, nodeType, name, description)
{
	DE_ASSERT(nodeType == TESTNODETYPE_GROUP || nodeType == TESTNODETYPE_ROOT);
	DE_ASSERT(!parent == (nodeType == TESTNODETYPE_ROOT));
}